

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer *this_00;
  char cVar1;
  lexeme_t lVar2;
  nodetest_t axis;
  xpath_parse_result *pxVar3;
  xpath_ast_node *pxVar4;
  char_t *pcVar5;
  xpath_ast_node *pxVar6;
  xpath_ast_node **ppxVar7;
  ast_type_t type;
  char *pcVar8;
  char_t *in_R9;
  char *pcVar9;
  xpath_ast_node **ppxVar10;
  bool bVar11;
  xpath_ast_node *pxStack_50;
  xpath_allocator *local_48;
  char_t *pcStack_40;
  xpath_ast_node *local_38;
  
  if ((set != (xpath_ast_node *)0x0) && (set->_rettype != '\x01')) {
    pxVar3 = this->_result;
    pcVar8 = "Step has to be applied to node set";
LAB_0011dac8:
    pxVar3->error = pcVar8;
    goto LAB_0011db2c;
  }
  this_00 = &this->_lexer;
  lVar2 = (this->_lexer)._cur_lexeme;
  type = (ast_type_t)set;
  if (lVar2 == lex_double_dot) {
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxStack_50 = (xpath_ast_node *)0x9;
LAB_0011db4f:
      pxVar4 = alloc_node(this,type,pxStack_50,axis_attribute,nodetest_none,in_R9);
      return pxVar4;
    }
LAB_0011dabd:
    pxVar3 = this->_result;
    pcVar8 = "Predicates are not allowed after an abbreviated step";
    goto LAB_0011dac8;
  }
  if (lVar2 == lex_dot) {
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxStack_50 = (xpath_ast_node *)0xc;
      goto LAB_0011db4f;
    }
    goto LAB_0011dabd;
  }
  bVar11 = lVar2 != lex_axis_attribute;
  if (bVar11) {
    pxStack_50 = (xpath_ast_node *)0x3;
    pcVar8 = &set->_type;
  }
  else {
    xpath_lexer::next(this_00);
    lVar2 = (this->_lexer)._cur_lexeme;
    pxStack_50 = (xpath_ast_node *)0x2;
    pcVar8 = &set->_type;
  }
  if (lVar2 == lex_multiply) goto LAB_0011de26;
  if (lVar2 != lex_string) {
    pcVar9 = "Unrecognized node test";
    goto switchD_0011db93_caseD_62;
  }
  local_38 = (xpath_ast_node *)&(this->_lexer)._cur_lexeme_contents;
  local_48 = (xpath_allocator *)(this->_lexer)._cur_lexeme_contents.begin;
  pcStack_40 = (this->_lexer)._cur_lexeme_contents.end;
  xpath_lexer::next(this_00);
  lVar2 = (this->_lexer)._cur_lexeme;
  if (lVar2 != lex_double_colon) goto LAB_0011dd44;
  if (!bVar11) {
    pcVar9 = "Two axis specifiers in one step";
    goto switchD_0011db93_caseD_62;
  }
  cVar1 = *(char *)&local_48->_root;
  pcVar9 = "Unknown axis";
  switch(cVar1) {
  case 'a':
    pcVar8 = "ancestor";
    bVar11 = xpath_lexer_string::operator==
                       ((xpath_lexer_string *)&stack0xffffffffffffffb8,"ancestor");
    pxStack_50 = (xpath_ast_node *)0x0;
    if (!bVar11) {
      pcVar8 = "ancestor-or-self";
      bVar11 = xpath_lexer_string::operator==
                         ((xpath_lexer_string *)&stack0xffffffffffffffb8,"ancestor-or-self");
      if (bVar11) {
        pxStack_50 = (xpath_ast_node *)0x1;
      }
      else {
        pcVar8 = "attribute";
        bVar11 = xpath_lexer_string::operator==
                           ((xpath_lexer_string *)&stack0xffffffffffffffb8,"attribute");
        if (!bVar11) break;
        pxStack_50 = (xpath_ast_node *)0x2;
      }
    }
    goto LAB_0011dd0d;
  case 'b':
  case 'e':
    break;
  case 'c':
    pcVar8 = "child";
    bVar11 = xpath_lexer_string::operator==((xpath_lexer_string *)&stack0xffffffffffffffb8,"child");
    if (bVar11) {
      pxStack_50 = (xpath_ast_node *)0x3;
      goto LAB_0011dd0d;
    }
    break;
  case 'd':
    pcVar8 = "descendant";
    bVar11 = xpath_lexer_string::operator==
                       ((xpath_lexer_string *)&stack0xffffffffffffffb8,"descendant");
    if (bVar11) {
      pxStack_50 = (xpath_ast_node *)0x4;
    }
    else {
      pcVar8 = "descendant-or-self";
      bVar11 = xpath_lexer_string::operator==
                         ((xpath_lexer_string *)&stack0xffffffffffffffb8,"descendant-or-self");
      if (!bVar11) break;
      pxStack_50 = (xpath_ast_node *)0x5;
    }
    goto LAB_0011dd0d;
  case 'f':
    pcVar8 = "following";
    bVar11 = xpath_lexer_string::operator==
                       ((xpath_lexer_string *)&stack0xffffffffffffffb8,"following");
    if (bVar11) {
      pxStack_50 = (xpath_ast_node *)0x6;
    }
    else {
      pcVar8 = "following-sibling";
      bVar11 = xpath_lexer_string::operator==
                         ((xpath_lexer_string *)&stack0xffffffffffffffb8,"following-sibling");
      if (!bVar11) break;
      pxStack_50 = (xpath_ast_node *)0x7;
    }
LAB_0011dd0d:
    xpath_lexer::next(this_00);
    lVar2 = (this->_lexer)._cur_lexeme;
    if (lVar2 == lex_multiply) {
LAB_0011de26:
      pcStack_40 = (char_t *)0x0;
      local_48 = (xpath_allocator *)0x0;
      xpath_lexer::next(this_00);
      axis = nodetest_all;
LAB_0011de32:
      pcVar5 = alloc_string(this,(xpath_lexer_string *)&stack0xffffffffffffffb8);
      if (pcVar5 == (char_t *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      local_38 = alloc_node(this,type,pxStack_50,axis,(nodetest_t)pcVar5,in_R9);
      if (local_38 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      ppxVar10 = &local_38->_right;
      pxVar4 = (xpath_ast_node *)0x0;
      while( true ) {
        if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
          return local_38;
        }
        xpath_lexer::next(this_00);
        pxVar6 = parse_expression(this,0);
        if (pxVar6 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar6 = alloc_node(this,ast_predicate,(xpath_ast_node *)0x0,pxVar6,(predicate_t)pcVar5);
        if (pxVar6 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        if ((this->_lexer)._cur_lexeme != lex_close_square_brace) break;
        xpath_lexer::next(this_00);
        ppxVar7 = &pxVar4->_next;
        if (pxVar4 == (xpath_ast_node *)0x0) {
          ppxVar7 = ppxVar10;
        }
        *ppxVar7 = pxVar6;
        pxVar4 = pxVar6;
      }
      pcVar9 = "Expected \']\' to match an opening \'[\'";
    }
    else {
      pcVar9 = "Unrecognized node test";
      if (lVar2 == lex_string) {
        local_48 = (xpath_allocator *)((xpath_lexer_string *)local_38)->begin;
        pcStack_40 = ((xpath_lexer_string *)local_38)->end;
        xpath_lexer::next(this_00);
        lVar2 = (this->_lexer)._cur_lexeme;
LAB_0011dd44:
        if (lVar2 != lex_open_brace) {
          axis = nodetest_name;
          if (((2 < (long)pcStack_40 - (long)local_48) && (pcStack_40[-2] == ':')) &&
             (pcStack_40[-1] == '*')) {
            axis = nodetest_all_in_namespace;
            pcStack_40 = pcStack_40 + -1;
          }
          goto LAB_0011de32;
        }
        xpath_lexer::next(this_00);
        lVar2 = (this->_lexer)._cur_lexeme;
        if (lVar2 == lex_close_brace) {
          xpath_lexer::next(this_00);
          axis = parse_node_test_type
                           ((xpath_parser *)&stack0xffffffffffffffb8,(xpath_lexer_string *)pcVar8);
          if (axis != nodetest_none) {
            local_48 = (xpath_allocator *)0x0;
            pcStack_40 = (char_t *)0x0;
            goto LAB_0011de32;
          }
          pcVar9 = "Unrecognized node type";
        }
        else {
          bVar11 = xpath_lexer_string::operator==
                             ((xpath_lexer_string *)&stack0xffffffffffffffb8,
                              "processing-instruction");
          if (bVar11) {
            if (lVar2 == lex_quoted_string) {
              local_48 = (xpath_allocator *)((xpath_lexer_string *)local_38)->begin;
              pcStack_40 = ((xpath_lexer_string *)local_38)->end;
              xpath_lexer::next(this_00);
              if ((this->_lexer)._cur_lexeme == lex_close_brace) {
                axis = nodetest_pi;
                xpath_lexer::next(this_00);
                goto LAB_0011de32;
              }
              pcVar9 = "Unmatched brace near processing-instruction()";
            }
            else {
              pcVar9 = "Only literals are allowed as arguments to processing-instruction()";
            }
          }
          else {
            pcVar9 = "Unmatched brace near node type test";
          }
        }
      }
    }
    break;
  default:
    if (cVar1 == 'n') {
      pcVar8 = "namespace";
      bVar11 = xpath_lexer_string::operator==
                         ((xpath_lexer_string *)&stack0xffffffffffffffb8,"namespace");
      if (bVar11) {
        pxStack_50 = (xpath_ast_node *)0x8;
        goto LAB_0011dd0d;
      }
    }
    else {
      if (cVar1 == 'p') {
        pcVar8 = "parent";
        bVar11 = xpath_lexer_string::operator==
                           ((xpath_lexer_string *)&stack0xffffffffffffffb8,"parent");
        if (bVar11) {
          pxStack_50 = (xpath_ast_node *)0x9;
        }
        else {
          pcVar8 = "preceding";
          bVar11 = xpath_lexer_string::operator==
                             ((xpath_lexer_string *)&stack0xffffffffffffffb8,"preceding");
          if (bVar11) {
            pxStack_50 = (xpath_ast_node *)0xa;
          }
          else {
            pcVar8 = "preceding-sibling";
            bVar11 = xpath_lexer_string::operator==
                               ((xpath_lexer_string *)&stack0xffffffffffffffb8,"preceding-sibling");
            if (!bVar11) break;
            pxStack_50 = (xpath_ast_node *)0xb;
          }
        }
        goto LAB_0011dd0d;
      }
      if (cVar1 == 's') {
        pcVar8 = "self";
        bVar11 = xpath_lexer_string::operator==
                           ((xpath_lexer_string *)&stack0xffffffffffffffb8,"self");
        if (bVar11) {
          pxStack_50 = (xpath_ast_node *)0xc;
          goto LAB_0011dd0d;
        }
      }
    }
  }
switchD_0011db93_caseD_62:
  pxVar3 = this->_result;
  pxVar3->error = pcVar9;
LAB_0011db2c:
  pxVar3->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return 0;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return 0;

			xpath_ast_node* last = 0;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return 0;

				xpath_ast_node* pred = alloc_node(ast_predicate, 0, expr, predicate_default);
				if (!pred) return 0;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			return n;
		}